

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcg_basic.c
# Opt level: O1

uint32_t pcg32_boundedrand(uint32_t bound)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar2 = (ulong)-bound % (ulong)bound;
  do {
    uVar3 = (uint)(pcg32_global_0 >> 0x2d) ^ (uint)(pcg32_global_0 >> 0x1b);
    bVar1 = (byte)(pcg32_global_0 >> 0x3b);
    uVar4 = uVar3 >> bVar1 | uVar3 << 0x20 - bVar1;
    uVar3 = (uint)((ulong)-bound % (ulong)bound);
    if (uVar3 <= uVar4) {
      uVar2 = (ulong)uVar4 % (ulong)bound;
    }
    pcg32_global_0 = pcg32_global_0 * 0x5851f42d4c957f2d + pcg32_global_1;
  } while (uVar4 < uVar3);
  return (uint32_t)uVar2;
}

Assistant:

uint32_t pcg32_boundedrand_r(pcg32_random_t* rng, uint32_t bound)
{
    // To avoid bias, we need to make the range of the RNG a multiple of
    // bound, which we do by dropping output less than a threshold.
    // A naive scheme to calculate the threshold would be to do
    //
    //     uint32_t threshold = 0x100000000ull % bound;
    //
    // but 64-bit div/mod is slower than 32-bit div/mod (especially on
    // 32-bit platforms).  In essence, we do
    //
    //     uint32_t threshold = (0x100000000ull-bound) % bound;
    //
    // because this version will calculate the same modulus, but the LHS
    // value is less than 2^32.

    uint32_t threshold = -bound % bound;

    // Uniformity guarantees that this loop will terminate.  In practice, it
    // should usually terminate quickly; on average (assuming all bounds are
    // equally likely), 82.25% of the time, we can expect it to require just
    // one iteration.  In the worst case, someone passes a bound of 2^31 + 1
    // (i.e., 2147483649), which invalidates almost 50% of the range.  In 
    // practice, bounds are typically small and only a tiny amount of the range
    // is eliminated.
    for (;;) {
        uint32_t r = pcg32_random_r(rng);
        if (r >= threshold)
            return r % bound;
    }
}